

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::InputFile::Data::bufferedReadPixels(Data *this,int scanLine1,int scanLine2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  ArgExc *this_00;
  Iterator IVar7;
  Data *in_RDI;
  exr_attr_box2i_t eVar8;
  int in_stack_0000008c;
  ConstIterator c;
  int in_stack_0000009c;
  Context *in_stack_000000a0;
  ConstIterator k;
  int width;
  int xStart;
  int maxYThisRow;
  int minYThisRow;
  Box2i tileRange;
  int j;
  int maxDy;
  int minDy;
  int maxY;
  int minY;
  exr_attr_box2i_t dataWindow;
  FrameBuffer *in_stack_00000138;
  TiledInputFile *in_stack_00000140;
  int in_stack_0000024c;
  int in_stack_00000250;
  int in_stack_00000254;
  int in_stack_00000258;
  int in_stack_0000025c;
  TiledInputFile *in_stack_00000260;
  int in_stack_00000270;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  TiledInputFile *in_stack_fffffffffffffed8;
  bool local_109;
  undefined8 in_stack_ffffffffffffff38;
  iterator in_stack_ffffffffffffff40;
  Data *in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff50;
  int width_00;
  undefined8 local_88;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  iterator in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  const_iterator in_stack_ffffffffffffffb0;
  uint width_01;
  char *in_stack_ffffffffffffffd0;
  int iVar9;
  int iVar10;
  int local_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int local_10;
  int local_c [3];
  
  getPartIdx(in_RDI);
  eVar8 = Context::dataWindow(in_stack_000000a0,in_stack_0000009c);
  piVar6 = std::min<int>(local_c,&local_10);
  iVar10 = *piVar6;
  piVar6 = std::max<int>(local_c,&local_10);
  iVar9 = *piVar6;
  iStack_1c = eVar8.min.y;
  if ((iVar10 < iStack_1c) || (iStack_14 = eVar8.max.y, iStack_14 < iVar9)) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc
              (this_00,"Tried to read scan line outside the image file\'s data window.");
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  uVar2 = iVar10 - iStack_1c;
  std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
  operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_> *)
             0x1f6fee);
  uVar3 = TiledInputFile::tileYSize((TiledInputFile *)0x1f6ff6);
  uVar2 = uVar2 / uVar3;
  uVar3 = iVar9 - iStack_1c;
  std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
  operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_> *)
             0x1f7027);
  uVar4 = TiledInputFile::tileYSize((TiledInputFile *)0x1f702f);
  if ((iVar10 == iStack_1c) && (iVar9 == iStack_14)) {
    std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
    operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_> *
               )0x1f7072);
    TiledInputFile::setFrameBuffer(in_stack_00000140,in_stack_00000138);
    std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
    operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_> *
               )0x1f7094);
    std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
    operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_> *
               )0x1f70a7);
    TiledInputFile::numXTiles((TiledInputFile *)c._i._M_node,in_stack_0000008c);
    TiledInputFile::readTiles
              (in_stack_00000260,in_stack_0000025c,in_stack_00000258,in_stack_00000254,
               in_stack_00000250,in_stack_0000024c,in_stack_00000270);
  }
  else {
    std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
    operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_> *
               )0x1f70ef);
    std::unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::operator*
              ((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    TiledInputFile::setFrameBuffer(in_stack_00000140,in_stack_00000138);
    width_01 = uVar2;
    for (; (int)uVar2 <= (int)(uVar3 / uVar4); uVar2 = uVar2 + 1) {
      if (uVar2 != in_RDI->_cachedTileY) {
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>
                            *)0x1f715d);
        local_109 = false;
        if (bVar1) {
          std::unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::
          operator->((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *
                     )0x1f7180);
          in_stack_ffffffffffffffb0._M_node =
               (_Base_ptr)
               FrameBuffer::begin((FrameBuffer *)
                                  CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          FrameBuffer::ConstIterator::ConstIterator
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (Iterator *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          std::unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::
          operator->((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *
                     )0x1f71b6);
          in_stack_ffffffffffffffa0._M_node =
               (_Base_ptr)
               FrameBuffer::end((FrameBuffer *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          FrameBuffer::ConstIterator::ConstIterator
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (Iterator *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_109 = Imf_3_4::operator!=((ConstIterator *)
                                          CONCAT44(in_stack_fffffffffffffed4,
                                                   in_stack_fffffffffffffed0),
                                          (ConstIterator *)
                                          CONCAT44(in_stack_fffffffffffffecc,
                                                   in_stack_fffffffffffffec8));
        }
        if (local_109 != false) {
          std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
          operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                      *)0x1f720c);
          std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
          operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                      *)0x1f721f);
          TiledInputFile::numXTiles((TiledInputFile *)c._i._M_node,in_stack_0000008c);
          in_stack_fffffffffffffec8 = 0;
          TiledInputFile::readTiles
                    (in_stack_00000260,in_stack_0000025c,in_stack_00000258,in_stack_00000254,
                     in_stack_00000250,in_stack_0000024c,in_stack_00000270);
        }
        in_RDI->_cachedTileY = uVar2;
      }
      std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
      operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                  *)0x1f7274);
      TiledInputFile::dataWindowForTile
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffecc);
      std::max<int>((int *)&stack0xffffffffffffffdc,(int *)&stack0xffffffffffffff94);
      std::min<int>((int *)&stack0xffffffffffffffd8,(int *)&stack0xffffffffffffff9c);
      local_20 = eVar8.min.x;
      local_18 = eVar8.max.x;
      iVar5 = (local_18 - local_20) + 1;
      FrameBuffer::begin((FrameBuffer *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      FrameBuffer::ConstIterator::ConstIterator
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (Iterator *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      while( true ) {
        IVar7 = FrameBuffer::end((FrameBuffer *)
                                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        width_00 = (int)IVar7._i._M_node;
        FrameBuffer::ConstIterator::ConstIterator
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (Iterator *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        bVar1 = Imf_3_4::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        if (!bVar1) break;
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>
                            *)0x1f738a);
        if (bVar1) {
          std::unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::
          operator->((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *
                     )0x1f73a4);
          FrameBuffer::ConstIterator::name((ConstIterator *)0x1f73b6);
          in_stack_ffffffffffffff50._M_node =
               (_Base_ptr)
               FrameBuffer::find((FrameBuffer *)CONCAT44(iVar10,iVar9),in_stack_ffffffffffffffd0);
          FrameBuffer::ConstIterator::ConstIterator
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (Iterator *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          std::unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::
          operator->((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *
                     )0x1f73f1);
          in_stack_ffffffffffffff40._M_node =
               (_Base_ptr)
               FrameBuffer::end((FrameBuffer *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          FrameBuffer::ConstIterator::ConstIterator
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (Iterator *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          bVar1 = Imf_3_4::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
          ;
          if (!bVar1) goto LAB_001f748b;
          in_stack_fffffffffffffec8 = local_20;
          in_stack_fffffffffffffed0 = iVar5;
          in_stack_ffffffffffffff38 = local_88;
          copyCachedBuffer((Data *)in_stack_ffffffffffffffa0._M_node,
                           (ConstIterator)in_stack_ffffffffffffffb0._M_node,
                           (ConstIterator)in_stack_ffffffffffffffa8._M_node,
                           in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff94,uVar2,width_01);
        }
        else {
LAB_001f748b:
          in_stack_fffffffffffffec8 = iVar5;
          fillBuffer(in_stack_ffffffffffffff48,(ConstIterator)in_stack_ffffffffffffff50._M_node,
                     (int)((ulong)in_stack_ffffffffffffff40._M_node >> 0x20),
                     (int)in_stack_ffffffffffffff40._M_node,
                     (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38,
                     width_00);
        }
        FrameBuffer::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      }
    }
  }
  return;
}

Assistant:

void
InputFile::Data::bufferedReadPixels (int scanLine1, int scanLine2)
{
    exr_attr_box2i_t dataWindow = _ctxt->dataWindow (getPartIdx ());

    //
    // bufferedReadPixels reads each row of tiles that intersect the
    // scan-line range (scanLine1 to scanLine2). The previous row of
    // tiles is cached in order to prevent redundant tile reads when
    // accessing scanlines sequentially.
    //

    int minY = std::min (scanLine1, scanLine2);
    int maxY = std::max (scanLine1, scanLine2);

    if (minY < dataWindow.min.y || maxY > dataWindow.max.y)
    {
        throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
                                     "the image file's data window.");
    }

    int minDy = (minY - dataWindow.min.y) / _tFile->tileYSize ();
    int maxDy = (maxY - dataWindow.min.y) / _tFile->tileYSize ();

    // if we're reading the whole thing, just skip the double copy entirely
    if (minY == dataWindow.min.y && maxY == dataWindow.max.y)
    {
        _tFile->setFrameBuffer (_cacheFrameBuffer);
        _tFile->readTiles (0, _tFile->numXTiles (0) - 1, minDy, maxDy, 0, 0);
        return;
    }

    _tFile->setFrameBuffer (*_cachedBuffer);

    for ( int j = minDy; j <= maxDy; ++j )
    {
        if (j != _cachedTileY)
        {
            //
            // We don't have any valid buffered info, so we need to read in
            // from the file.
            // if no channels are being read that are present in file, cachedBuffer will be empty
            //

            if (_cachedBuffer &&
                _cachedBuffer->begin () != _cachedBuffer->end ())
            {
                _tFile->readTiles (0, _tFile->numXTiles (0) - 1, j, j, 0, 0);
            }

            _cachedTileY = j;
        }

        IMATH_NAMESPACE::Box2i tileRange = _tFile->dataWindowForTile (0, j, 0);

        int minYThisRow = std::max (minY, tileRange.min.y);
        int maxYThisRow = std::min (maxY, tileRange.max.y);

        int xStart = dataWindow.min.x;
        int width = dataWindow.max.x - dataWindow.min.x + 1;

        for (FrameBuffer::ConstIterator k = _cacheFrameBuffer.begin ();
             k != _cacheFrameBuffer.end ();
             ++k)
        {
            if (_cachedBuffer)
            {
                FrameBuffer::ConstIterator c = _cachedBuffer->find (k.name ());
                if (c != _cachedBuffer->end ())
                {
                    copyCachedBuffer (k, c, minYThisRow, maxYThisRow,
                                      tileRange.min.y, xStart, width);
                    continue;
                }
            }
            fillBuffer (k, minYThisRow, maxYThisRow,
                        dataWindow.min.y, xStart, width);
        }
    }
}